

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O2

void __thiscall
o3dgc::BinaryStream::WriteUInt32Bin(BinaryStream *this,unsigned_long position,unsigned_long value)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  
  if (position < (this->m_stream).m_size - 4) {
    uVar4 = (uchar)(value >> 0x18);
    uVar2 = (uchar)(value >> 0x10);
    uVar1 = (uchar)(value >> 8);
    uVar5 = (uchar)value;
    uVar3 = uVar1;
    if (this->m_endianness != O3DGC_BIG_ENDIAN) {
      uVar5 = uVar4;
      uVar3 = uVar2;
      uVar4 = (uchar)value;
      uVar2 = uVar1;
    }
    (this->m_stream).m_buffer[position] = uVar4;
    (this->m_stream).m_buffer[position + 1] = uVar2;
    (this->m_stream).m_buffer[position + 2] = uVar3;
    (this->m_stream).m_buffer[position + 3] = uVar5;
    return;
  }
  __assert_fail("position < m_stream.GetSize() - 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0xbc,"void o3dgc::BinaryStream::WriteUInt32Bin(unsigned long, unsigned long)");
}

Assistant:

T *                     GetBuffer()       { return m_buffer;}